

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O2

void xercesc_4_0::XMLBigDecimal::parseDecimal
               (XMLCh *toParse,XMLCh *retBuffer,int *sign,int *totalDigits,int *fractDigits,
               MemoryManager *manager)

{
  XMLCh *pXVar1;
  ushort uVar2;
  short sVar3;
  XMLCh XVar4;
  short *psVar5;
  XMLSize_t XVar6;
  XMLCh *pXVar7;
  NumberFormatException *this;
  long lVar8;
  bool bVar9;
  short *psVar10;
  XMLCh *pXVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  
  *retBuffer = L'\0';
  *totalDigits = 0;
  *fractDigits = 0;
  lVar13 = -2;
  do {
    lVar8 = lVar13;
    uVar2 = *(ushort *)((long)toParse + lVar8 + 2);
    lVar13 = lVar8 + 2;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar2] < '\0');
  if (uVar2 == 0) {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
               ,0xdd,XMLNUM_WSString,manager);
  }
  else {
    psVar5 = (short *)((long)toParse + lVar8 + 4);
    XVar6 = XMLString::stringLen(toParse);
    lVar8 = -2 - (long)(toParse + XVar6);
    pXVar7 = toParse + XVar6 + 1;
    lVar14 = lVar13 + XVar6 * -2;
    do {
      pXVar11 = pXVar7 + -2;
      lVar8 = lVar8 + 2;
      pXVar7 = pXVar7 + -1;
      lVar14 = lVar14 + 2;
    } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar11] < '\0');
    *sign = 1;
    sVar3 = *(short *)(lVar13 + (long)toParse);
    if (sVar3 == 0x2b) {
      psVar10 = psVar5;
      if (lVar14 == 0) {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                   ,0xf5,XMLNUM_Inv_chars,manager);
        goto LAB_00260e5f;
      }
    }
    else {
      psVar10 = (short *)(lVar13 + (long)toParse);
      if ((sVar3 == 0x2d) && (*sign = -1, psVar10 = psVar5, lVar14 == 0)) {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                   ,0xed,XMLNUM_Inv_chars,manager);
        goto LAB_00260e5f;
      }
    }
    pXVar11 = psVar10 + -1;
    do {
      pXVar1 = pXVar11 + 1;
      pXVar11 = pXVar11 + 1;
    } while (*pXVar1 == L'0');
    if (pXVar7 <= pXVar11) {
      *sign = 0;
      return;
    }
    bVar9 = false;
    while( true ) {
      uVar12 = -(long)pXVar11 - lVar8;
      while( true ) {
        if (pXVar7 <= pXVar11) {
          for (; (0 < *fractDigits && (retBuffer[-1] == L'0')); retBuffer = retBuffer + -1) {
            *fractDigits = *fractDigits + -1;
            *totalDigits = *totalDigits + -1;
          }
          if (*totalDigits == 0) {
            *sign = 0;
          }
          *retBuffer = L'\0';
          return;
        }
        XVar4 = *pXVar11;
        if (XVar4 != L'.') break;
        if (bVar9) {
          this = (NumberFormatException *)__cxa_allocate_exception(0x30);
          NumberFormatException::NumberFormatException
                    (this,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                     ,0x115,XMLNUM_2ManyDecPoint,manager);
          goto LAB_00260e5f;
        }
        *fractDigits = (int)(uVar12 >> 1) + -1;
        pXVar11 = pXVar11 + 1;
        uVar12 = uVar12 - 2;
        bVar9 = true;
      }
      if ((ushort)(XVar4 + L'ￆ') < 0xfff6) break;
      pXVar11 = pXVar11 + 1;
      *retBuffer = XVar4;
      retBuffer = retBuffer + 1;
      *totalDigits = *totalDigits + 1;
    }
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
               ,0x11a,XMLNUM_Inv_chars,manager);
  }
LAB_00260e5f:
  __cxa_throw(this,&NumberFormatException::typeinfo,XMLException::~XMLException);
}

Assistant:

void  XMLBigDecimal::parseDecimal(const XMLCh* const toParse
                               ,        XMLCh* const retBuffer
                               ,        int&         sign
                               ,        int&         totalDigits
                               ,        int&         fractDigits
                               ,        MemoryManager* const manager)
{
    //init
    retBuffer[0] = chNull;
    totalDigits = 0;
    fractDigits = 0;

    // Strip leading white space, if any. 
    const XMLCh* startPtr = toParse;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    // If we hit the end, then return failure
    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Strip tailing white space, if any.
    const XMLCh* endPtr = toParse + XMLString::stringLen(toParse);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    // '+' or '-' is allowed only at the first position
    // and is NOT included in the return parsed string
    sign = 1;
    if (*startPtr == chDash)
    {
        sign = -1;
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        startPtr++;         
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }

    // Strip leading zeros
    while (*startPtr == chDigit_0)
        startPtr++;

    // containning zero, only zero, nothing but zero
    // it is a zero, indeed
    if (startPtr >= endPtr)
    {
        sign = 0;
        return;
    }

    XMLCh* retPtr = (XMLCh*) retBuffer;

    // Scan data
    bool   dotSignFound = false;
    while (startPtr < endPtr)
    {
        if (*startPtr == chPeriod)
        {
            if (!dotSignFound)
            {
                dotSignFound = true;
                fractDigits = (int)(endPtr - startPtr - 1);
                startPtr++;
                continue;
            }
            else  // '.' is allowed only once
                ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_2ManyDecPoint, manager);
        }

        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        // copy over
        *retPtr++ = *startPtr++;
        totalDigits++;
    }

    /***
    E2-44 totalDigits

     ... by restricting it to numbers that are expressible as i x 10^-n
     where i and n are integers such that |i| < 10^totalDigits and 0 <= n <= totalDigits. 

        normalization: remove all trailing zero after the '.'
                       and adjust the scaleValue as well.
    ***/
    while ((fractDigits > 0) && (*(retPtr-1) == chDigit_0))          
    {
        retPtr--;
        fractDigits--;
        totalDigits--;
    }
    // 0.0 got past the check for zero because of the decimal point, so we need to double check it here
    if(totalDigits==0)
        sign = 0;

    *retPtr = chNull;   //terminated
    return;
}